

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zesSchedulerSetTimeoutMode
          (zes_sched_handle_t hScheduler,zes_sched_timeout_properties_t *pProperties,
          ze_bool_t *pNeedReload)

{
  zes_pfnSchedulerSetTimeoutMode_t pfnSetTimeoutMode;
  dditable_t *dditable;
  ze_result_t result;
  ze_bool_t *pNeedReload_local;
  zes_sched_timeout_properties_t *pProperties_local;
  zes_sched_handle_t hScheduler_local;
  
  if (*(code **)(*(long *)(hScheduler + 8) + 0xa60) == (code *)0x0) {
    hScheduler_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hScheduler_local._4_4_ =
         (**(code **)(*(long *)(hScheduler + 8) + 0xa60))
                   (*(undefined8 *)hScheduler,pProperties,pNeedReload);
  }
  return hScheduler_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesSchedulerSetTimeoutMode(
        zes_sched_handle_t hScheduler,                  ///< [in] Sysman handle for the component.
        zes_sched_timeout_properties_t* pProperties,    ///< [in] The properties to use when configurating this mode.
        ze_bool_t* pNeedReload                          ///< [in,out] Will be set to TRUE if a device driver reload is needed to
                                                        ///< apply the new scheduler mode.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_sched_object_t*>( hScheduler )->dditable;
        auto pfnSetTimeoutMode = dditable->zes.Scheduler.pfnSetTimeoutMode;
        if( nullptr == pfnSetTimeoutMode )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hScheduler = reinterpret_cast<zes_sched_object_t*>( hScheduler )->handle;

        // forward to device-driver
        result = pfnSetTimeoutMode( hScheduler, pProperties, pNeedReload );

        return result;
    }